

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoped_ptr.hpp
# Opt level: O2

void __thiscall
asio::detail::scoped_ptr<asio::detail::posix_thread>::reset
          (scoped_ptr<asio::detail::posix_thread> *this,posix_thread *p)

{
  posix_thread *this_00;
  
  this_00 = this->p_;
  if (this_00 != (posix_thread *)0x0) {
    posix_thread::~posix_thread(this_00);
  }
  operator_delete(this_00);
  this->p_ = p;
  return;
}

Assistant:

void reset(T* p = 0)
  {
    delete p_;
    p_ = p;
  }